

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRuleParser::readWords(CollationRuleParser *this,int32_t i,UnicodeString *raw)

{
  UnicodeString *pUVar1;
  int iVar2;
  UBool UVar3;
  int32_t iVar4;
  __off_t __length;
  undefined4 in_register_00000034;
  ConstChar16Ptr local_38;
  char16_t local_2a;
  UnicodeString *pUStack_28;
  UChar c;
  UnicodeString *raw_local;
  CollationRuleParser *pCStack_18;
  int32_t i_local;
  CollationRuleParser *this_local;
  
  pUStack_28 = raw;
  raw_local._4_4_ = i;
  pCStack_18 = this;
  UnicodeString::remove(raw,(char *)CONCAT44(in_register_00000034,i));
  raw_local._4_4_ = skipWhiteSpace(this,raw_local._4_4_);
  while( true ) {
    iVar2 = raw_local._4_4_;
    iVar4 = UnicodeString::length(this->rules);
    if (iVar4 <= iVar2) {
      return 0;
    }
    local_2a = UnicodeString::charAt(this->rules,raw_local._4_4_);
    UVar3 = isSyntaxChar((uint)(ushort)local_2a);
    if (((UVar3 != '\0') && (local_2a != L'-')) && (local_2a != L'_')) break;
    UVar3 = PatternProps::isWhiteSpace((uint)(ushort)local_2a);
    if (UVar3 == '\0') {
      UnicodeString::append(pUStack_28,local_2a);
      raw_local._4_4_ = raw_local._4_4_ + 1;
    }
    else {
      UnicodeString::append(pUStack_28,L' ');
      raw_local._4_4_ = skipWhiteSpace(this,raw_local._4_4_ + 1);
    }
  }
  UVar3 = UnicodeString::isEmpty(pUStack_28);
  pUVar1 = pUStack_28;
  if (UVar3 != '\0') {
    return raw_local._4_4_;
  }
  ConstChar16Ptr::ConstChar16Ptr
            (&local_38,
             L" 㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㑲楓歮E㙎捩彵㌶㤱潃汬瑡潩剮汵健牡敳㡲浉潰瑲牥E硥数瑣摥愠爠獥瑥漠⁲敳瑴湩\x2067牯挠浯敭瑮爀獥瑥渠瑯映汯潬敷⁤祢愠爠汥瑡潩n敲敳⵴敢潦敲猠牴湥瑧\x2068楤晦牥⁳牦浯椠獴映物瑳爠汥瑡潩n敲敳⵴敢潦敲猠牴湥瑧\x2068潦汬睯摥戠⁹⁡瑳潲杮牥爠汥瑡潩n敲敳⁴楷桴畯⁴潰楳楴湯椀\x206e瀧敲楦籸瑳❲\x202c牰晥硩愠摮猠牴洠獵⁴慥档猠慴瑲眠瑩\x2068湡丠䍆戠畯摮牡y業獳湩\x2067瑳牡敲ⵤ敲慬楴湯猠牴湩g瑳牡敲ⵤ敲慬楴湯猠牴湩\x2067獩渠瑯愠汬丠䑆椭敮瑲爀湡敧眠瑩潨瑵猠慴瑲椠\x206e瑳牡敲ⵤ敲慬楴湯猠牴湩g慲杮⁥楷桴畯⁴湥⁤湩猠慴牲摥爭汥瑡潩\x206e瑳楲杮爀湡敧猠慴瑲朠敲瑡牥琠慨\x206e湥⁤湩猠慴牲摥爭汥瑡潩\x206e瑳楲杮猀慴牲摥爭汥瑡潩\x206e瑳楲杮爠湡敧椠⁳潮⁴污\x206c䙎ⵄ湩牥t瑳牡敲ⵤ敲慬楴湯猠牴湩\x2067慲杮⁥潣瑮楡獮愠猠牵潲慧整猀慴牲摥爭汥瑡潩\x206e瑳楲杮爠湡敧挠湯慴湩⁳⭕䙆䑆\x202c⭕䙆䕆漠⁲⭕䙆䙆洀獩楳杮爠汥瑡潩\x206e瑳楲杮焀潵整⁤楬整慲\x206c整瑸洠獩楳杮琠牥業慮楴杮愠潰瑳潲桰e慢正汳獡\x2068獥慣数愠⁴桴⁥湥⁤景琠敨爠汵⁥瑳楲杮猀牴湩\x2067潣瑮楡獮愠\x206e湵慰物摥猠牵潲慧整猀牴湩\x2067潣瑮楡獮唠䘫䙆ⱄ唠䘫䙆⁅牯唠䘫䙆F潮⁴⁡慶楬⁤灳捥慩\x206c敲敳⁴潰楳楴湯攀灸捥整⁤⁡敳瑴湩⽧灯楴湯愠⁴嬧\'桛物条湡兡漠嵮椠⁳潮⁴畳灰牯整d硥数瑣摥氠湡畧条⁥慴\x2067湩嬠浩潰瑲氠湡呧条]楛灭牯⁴慬杮慔嵧椠⁳潮⁴畳灰牯整d楛灭牯⁴慬杮慔嵧映楡敬d潮⁴⁡慶楬⁤敳瑴湩⽧灯楴湯甀歮潮湷猠牣灩⁴牯爠潥摲牥挠摯e瑯敨獲甀扮污湡散⁤湕捩摯卥瑥瀠瑡整湲戠慲正瑥s潮⁴⁡慶楬⁤湕捩摯卥瑥瀠瑡整湲洀獩楳杮漠瑰潩⵮整浲湩瑡湩\x2067崧‧晡整⁲湕捩摯卥瑥瀠瑡整湲昀物瑳琠牥楴牡⁹杩潮慲汢e慬瑳琠牥楴牡⁹杩潮慲汢e楦獲⁴敳潣摮牡⁹杩潮慲汢e慬瑳猠捥湯慤祲椠湧牯扡敬昀物瑳瀠楲慭祲椠湧牯扡敬氀獡⁴牰浩牡⁹杩潮慲汢e楦獲⁴慶楲扡敬氀獡⁴慶楲扡敬昀物瑳爠来汵牡氀獡⁴敲畧慬r楦獲⁴浩汰捩瑩氀獡⁴浩汰捩瑩昀物瑳琠慲汩湩g慬瑳琠慲汩湩gvariable top"
            );
  UVar3 = UnicodeString::endsWith(pUVar1,&local_38,1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_38);
  pUVar1 = pUStack_28;
  if (UVar3 != '\0') {
    iVar4 = UnicodeString::length(pUStack_28);
    UnicodeString::truncate(pUVar1,(char *)(ulong)(iVar4 - 1),__length);
  }
  return raw_local._4_4_;
}

Assistant:

int32_t
CollationRuleParser::readWords(int32_t i, UnicodeString &raw) const {
    static const UChar sp = 0x20;
    raw.remove();
    i = skipWhiteSpace(i);
    for(;;) {
        if(i >= rules->length()) { return 0; }
        UChar c = rules->charAt(i);
        if(isSyntaxChar(c) && c != 0x2d && c != 0x5f) {  // syntax except -_
            if(raw.isEmpty()) { return i; }
            if(raw.endsWith(&sp, 1)) {  // remove trailing space
                raw.truncate(raw.length() - 1);
            }
            return i;
        }
        if(PatternProps::isWhiteSpace(c)) {
            raw.append(sp);
            i = skipWhiteSpace(i + 1);
        } else {
            raw.append(c);
            ++i;
        }
    }
}